

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void ss_swapmerge(uchar *T,int *PA,int *first,int *middle,int *last,int *buf,int bufsize,int depth)

{
  uint *puVar1;
  uint uVar2;
  undefined4 uVar3;
  uint uVar4;
  uint *puVar5;
  byte *pbVar6;
  byte *pbVar7;
  ulong uVar8;
  long lVar9;
  byte *pbVar10;
  uint *puVar11;
  ulong uVar12;
  uint *puVar13;
  uint *puVar14;
  uint *puVar15;
  byte *pbVar16;
  uint *puVar17;
  int *piVar18;
  uint uVar19;
  byte *pbVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  ulong uVar24;
  bool bVar25;
  bool bVar26;
  anon_struct_32_4_d8a569f3 stack [32];
  uint local_48c;
  int *local_468;
  ulong auStack_438 [3];
  uint auStack_420 [252];
  
  uVar8 = 0;
  local_48c = 0;
LAB_001cc739:
  do {
    uVar12 = (long)last - (long)middle;
    uVar24 = (long)uVar12 >> 2;
    iVar23 = (int)uVar8;
    if ((long)uVar24 <= (long)bufsize) {
      if ((middle < last) && (first < middle)) {
        iVar22 = (int)(uVar12 >> 2);
        if (0 < iVar22) {
          iVar22 = iVar22 + 1;
          lVar9 = 0;
          do {
            uVar3 = *(undefined4 *)((long)buf + lVar9);
            *(undefined4 *)((long)buf + lVar9) = *(undefined4 *)((long)middle + lVar9);
            *(undefined4 *)((long)middle + lVar9) = uVar3;
            lVar9 = lVar9 + 4;
            iVar22 = iVar22 + -1;
          } while (1 < iVar22);
        }
        puVar13 = (uint *)((long)buf + (uVar12 - 4));
        uVar21 = (int)*puVar13 >> 0x1f;
        local_468 = PA + (uVar21 ^ *puVar13);
        puVar15 = (uint *)middle + -1;
        uVar19 = (int)((uint *)middle)[-1] >> 0x1f;
        uVar21 = uVar19 * -2 - uVar21;
        piVar18 = PA + (uVar19 ^ ((uint *)middle)[-1]);
        puVar11 = (uint *)last + -1;
        uVar19 = ((uint *)last)[-1];
LAB_001cca35:
        pbVar16 = T + (long)*local_468 + 2;
        pbVar10 = T + (long)*piVar18 + 2;
        pbVar20 = T + (long)piVar18[1] + 2;
        bVar25 = pbVar10 < pbVar20;
        bVar26 = pbVar16 < T + (long)local_468[1] + 2;
        if ((bVar26) && (pbVar10 < pbVar20)) {
          if (*pbVar16 == *pbVar10) {
            pbVar6 = T + (long)*piVar18 + 3;
            pbVar7 = T + (long)*local_468 + 3;
            do {
              pbVar16 = pbVar7;
              pbVar10 = pbVar6;
              bVar25 = pbVar10 < pbVar20;
              bVar26 = pbVar16 < T + (long)local_468[1] + 2;
              if ((!bVar26) || (pbVar20 <= pbVar10)) goto LAB_001ccaaf;
              pbVar6 = pbVar10 + 1;
              pbVar7 = pbVar16 + 1;
            } while (*pbVar16 == *pbVar10);
          }
          bVar26 = true;
          bVar25 = true;
        }
LAB_001ccaaf:
        if (bVar26) {
          iVar22 = 1;
          if (bVar25 != false) {
            iVar22 = (uint)*pbVar16 - (uint)*pbVar10;
          }
        }
        else {
          iVar22 = -(uint)bVar25;
        }
        puVar17 = (uint *)buf;
        if (0 < iVar22) {
          puVar14 = puVar13;
          if ((uVar21 & 1) != 0) {
            do {
              *puVar11 = *puVar13;
              puVar14 = puVar11 + -1;
              puVar11 = puVar11 + -1;
              *puVar13 = *puVar14;
              puVar14 = puVar13 + -1;
              puVar13 = puVar13 + -1;
            } while ((int)*puVar14 < 0);
            uVar21 = uVar21 & 0xfffffffe;
            puVar14 = puVar13;
          }
          *puVar11 = *puVar14;
          if (puVar14 <= buf) goto LAB_001cd43b;
          puVar11 = puVar11 + -1;
          puVar13 = puVar14 + -1;
          *puVar14 = *puVar11;
          uVar2 = puVar14[-1];
          if ((long)(int)uVar2 < 0) {
            local_468 = PA + ~uVar2;
            uVar21 = uVar21 | 1;
          }
          else {
            local_468 = PA + (int)uVar2;
          }
          goto LAB_001cca35;
        }
        if (iVar22 < 0) {
          if ((uVar21 & 2) != 0) {
            do {
              *puVar11 = *puVar15;
              puVar17 = puVar11 + -1;
              puVar11 = puVar11 + -1;
              *puVar15 = *puVar17;
              puVar17 = puVar15 + -1;
              puVar15 = puVar15 + -1;
            } while ((int)*puVar17 < 0);
            uVar21 = uVar21 & 0xfffffffd;
          }
          *puVar11 = *puVar15;
          puVar17 = puVar11 + -1;
          puVar11 = puVar11 + -1;
          *puVar15 = *puVar17;
          puVar15 = puVar15 + -1;
          if (puVar15 < first) break;
          uVar2 = *puVar15;
          uVar4 = ~uVar2;
          if (-1 < (int)uVar2) {
            uVar4 = uVar2;
          }
          if (-1 >= (int)uVar2) {
            uVar21 = uVar21 | 2;
          }
          piVar18 = PA + uVar4;
          goto LAB_001cca35;
        }
        if ((uVar21 & 1) != 0) {
          do {
            *puVar11 = *puVar13;
            puVar14 = puVar11 + -1;
            puVar11 = puVar11 + -1;
            *puVar13 = *puVar14;
            puVar14 = puVar13 + -1;
            puVar13 = puVar13 + -1;
          } while ((int)*puVar14 < 0);
          uVar21 = uVar21 & 0xfffffffe;
        }
        *puVar11 = ~*puVar13;
        if (buf < puVar13) {
          puVar17 = puVar11 + -1;
          *puVar13 = puVar11[-1];
          if ((uVar21 & 2) != 0) {
            do {
              *puVar17 = *puVar15;
              puVar11 = puVar17 + -1;
              puVar17 = puVar17 + -1;
              *puVar15 = *puVar11;
              puVar11 = puVar15 + -1;
              puVar15 = puVar15 + -1;
            } while ((int)*puVar11 < 0);
            uVar21 = uVar21 & 0xfffffffd;
          }
          puVar13 = puVar13 + -1;
          *puVar17 = *puVar15;
          puVar11 = puVar17 + -1;
          *puVar15 = puVar17[-1];
          puVar15 = puVar15 + -1;
          if (puVar15 < first) goto joined_r0x001cd3fe;
          uVar2 = *puVar13;
          uVar21 = uVar2 >> 0x1f | uVar21;
          local_468 = PA + ((int)uVar2 >> 0x1f ^ uVar2);
          uVar2 = *puVar15;
          if ((long)(int)uVar2 < 0) {
            piVar18 = PA + ~uVar2;
            uVar21 = uVar21 | 2;
          }
          else {
            piVar18 = PA + (int)uVar2;
          }
          goto LAB_001cca35;
        }
        goto LAB_001cd43b;
      }
      goto LAB_001cd43e;
    }
    uVar12 = (long)middle - (long)first;
    uVar8 = (long)uVar12 >> 2;
    if ((long)uVar8 <= (long)bufsize) {
      if (first < middle) {
        iVar22 = (int)(uVar12 >> 2);
        if (0 < iVar22) {
          iVar22 = iVar22 + 1;
          lVar9 = 0;
          do {
            uVar3 = *(undefined4 *)((long)buf + lVar9);
            *(undefined4 *)((long)buf + lVar9) = *(undefined4 *)((long)first + lVar9);
            *(undefined4 *)((long)first + lVar9) = uVar3;
            lVar9 = lVar9 + 4;
            iVar22 = iVar22 + -1;
          } while (1 < iVar22);
        }
        puVar15 = (uint *)((long)buf + (uVar12 - 4));
        uVar21 = *first;
        puVar11 = (uint *)buf;
        puVar13 = (uint *)first;
LAB_001cccfc:
        do {
          uVar19 = *middle;
          pbVar16 = T + (long)PA[(int)*puVar11] + 2;
          pbVar10 = T + (long)PA[(int)uVar19] + 2;
          pbVar20 = T + (long)PA[(long)(int)uVar19 + 1] + 2;
          bVar25 = pbVar10 < pbVar20;
          bVar26 = pbVar16 < T + (long)PA[(long)(int)*puVar11 + 1] + 2;
          if ((bVar26) && (pbVar10 < pbVar20)) {
            if (*pbVar16 == *pbVar10) {
              pbVar6 = T + (long)PA[(int)uVar19] + 3;
              pbVar7 = T + (long)PA[(int)*puVar11] + 3;
              do {
                pbVar16 = pbVar7;
                pbVar10 = pbVar6;
                bVar25 = pbVar10 < pbVar20;
                bVar26 = pbVar16 < T + (long)PA[(long)(int)*puVar11 + 1] + 2;
                if ((!bVar26) || (pbVar20 <= pbVar10)) goto LAB_001ccd80;
                pbVar6 = pbVar10 + 1;
                pbVar7 = pbVar16 + 1;
              } while (*pbVar16 == *pbVar10);
            }
            bVar26 = true;
            bVar25 = true;
          }
LAB_001ccd80:
          if (bVar26) {
            iVar22 = 1;
            if (bVar25 != false) {
              iVar22 = (uint)*pbVar16 - (uint)*pbVar10;
            }
          }
          else {
            iVar22 = -(uint)bVar25;
          }
          puVar17 = puVar11;
          if (iVar22 < 0) {
            do {
              *puVar13 = *puVar17;
              if (puVar15 <= puVar17) goto LAB_001cd251;
              puVar14 = puVar13 + 1;
              puVar13 = puVar13 + 1;
              puVar11 = puVar17 + 1;
              *puVar17 = *puVar14;
              puVar14 = puVar17 + 1;
              puVar17 = puVar11;
            } while ((int)*puVar14 < 0);
            goto LAB_001cccfc;
          }
          puVar17 = puVar13;
          if (iVar22 == 0) {
            *middle = ~uVar19;
            puVar17 = puVar13 + 2;
            puVar14 = puVar11;
            do {
              *puVar13 = *puVar14;
              if (puVar15 <= puVar14) goto LAB_001cd251;
              puVar1 = puVar13 + 1;
              puVar13 = puVar13 + 1;
              puVar11 = puVar14 + 1;
              *puVar14 = *puVar1;
              puVar1 = puVar14 + 1;
              puVar5 = puVar17;
              puVar17 = puVar17 + 1;
              puVar14 = puVar11;
            } while ((int)*puVar1 < 0);
            do {
              puVar13 = puVar5;
              puVar13[-1] = *middle;
              *middle = *puVar13;
              middle = (int *)((uint *)middle + 1);
              if (last <= middle) goto joined_r0x001cd20a;
              puVar5 = puVar13 + 1;
            } while (*middle < 0);
          }
          else {
            do {
              puVar13 = puVar17 + 1;
              *puVar17 = *middle;
              *middle = *puVar13;
              middle = (int *)((uint *)middle + 1);
              if (last <= middle) goto joined_r0x001cd0d0;
              puVar17 = puVar13;
            } while (*middle < 0);
          }
        } while( true );
      }
      goto LAB_001cd254;
    }
    if ((long)uVar8 < (long)uVar24) {
      uVar24 = uVar8;
    }
    uVar21 = 0;
    iVar22 = (int)uVar24;
    while (0 < iVar22) {
      uVar19 = (uint)uVar24;
      uVar24 = uVar24 >> 1 & 0x7fffffff;
      uVar8 = (ulong)((int)((uint *)middle)[(long)(int)uVar21 + uVar24] >> 0x1f ^
                     ((uint *)middle)[(long)(int)uVar21 + uVar24]);
      uVar12 = (ulong)((int)((uint *)middle)[(-1 - uVar24) - (long)(int)uVar21] >> 0x1f ^
                      ((uint *)middle)[(-1 - uVar24) - (long)(int)uVar21]);
      pbVar16 = T + (long)PA[uVar8] + 2;
      pbVar10 = T + (long)PA[uVar12] + 2;
      pbVar20 = T + (long)PA[uVar12 + 1] + 2;
      bVar25 = pbVar10 < pbVar20;
      bVar26 = pbVar16 < T + (long)PA[uVar8 + 1] + 2;
      if (((bVar26) && (pbVar10 < pbVar20)) && (*pbVar16 == *pbVar10)) {
        pbVar6 = T + (long)PA[uVar8] + 3;
        pbVar7 = T + (long)PA[uVar12] + 3;
        do {
          pbVar10 = pbVar7;
          pbVar16 = pbVar6;
          bVar25 = pbVar10 < pbVar20;
          bVar26 = pbVar16 < T + (long)PA[uVar8 + 1] + 2;
          if ((!bVar26) || (pbVar20 <= pbVar10)) break;
          pbVar6 = pbVar16 + 1;
          pbVar7 = pbVar10 + 1;
        } while (*pbVar16 == *pbVar10);
      }
      if (bVar26) {
        if (bVar25) {
          bVar25 = *pbVar16 < *pbVar10;
          goto LAB_001cc846;
        }
      }
      else {
LAB_001cc846:
        if (bVar25) {
          uVar21 = uVar21 + (int)uVar24 + 1;
          uVar24 = (ulong)((int)uVar24 - (~uVar19 & 1));
        }
      }
      iVar22 = (int)uVar24;
    }
    if ((int)uVar21 < 1) {
      uVar8 = (ulong)((int)((uint *)middle)[-1] >> 0x1f ^ ((uint *)middle)[-1]);
      uVar21 = *middle;
      pbVar16 = T + (long)PA[uVar8] + 2;
      pbVar10 = T + (long)PA[(int)uVar21] + 2;
      pbVar20 = T + (long)PA[(long)(int)uVar21 + 1] + 2;
      bVar25 = pbVar10 < pbVar20;
      bVar26 = pbVar16 < T + (long)PA[uVar8 + 1] + 2;
      if (((bVar26) && (pbVar10 < pbVar20)) && (*pbVar16 == *pbVar10)) {
        pbVar6 = T + (long)PA[(int)uVar21] + 3;
        pbVar7 = T + (long)PA[uVar8] + 3;
        do {
          pbVar16 = pbVar7;
          pbVar10 = pbVar6;
          bVar25 = pbVar10 < pbVar20;
          bVar26 = pbVar16 < T + (long)PA[uVar8 + 1] + 2;
          if ((!bVar26) || (pbVar20 <= pbVar10)) break;
          pbVar6 = pbVar10 + 1;
          pbVar7 = pbVar16 + 1;
        } while (*pbVar16 == *pbVar10);
      }
      if (bVar26) {
        iVar22 = 1;
        if (bVar25 != false) {
          iVar22 = (uint)*pbVar16 - (uint)*pbVar10;
        }
      }
      else {
        iVar22 = -(uint)bVar25;
      }
      if (iVar22 == 0) {
        *middle = ~uVar21;
      }
      if ((local_48c & 1) == 0) {
        if ((local_48c & 2) != 0) {
          uVar8 = (ulong)((int)((uint *)first)[-1] >> 0x1f ^ ((uint *)first)[-1]);
          pbVar16 = T + (long)PA[uVar8] + 2;
          pbVar10 = T + (long)PA[*first] + 2;
          pbVar20 = T + (long)PA[(long)*first + 1] + 2;
          bVar25 = pbVar10 < pbVar20;
          bVar26 = pbVar16 < T + (long)PA[uVar8 + 1] + 2;
          if (((bVar26) && (pbVar10 < pbVar20)) && (*pbVar16 == *pbVar10)) {
            pbVar6 = T + (long)PA[*first] + 3;
            pbVar7 = T + (long)PA[uVar8] + 3;
            do {
              pbVar16 = pbVar7;
              pbVar10 = pbVar6;
              bVar25 = pbVar10 < pbVar20;
              bVar26 = pbVar16 < T + (long)PA[uVar8 + 1] + 2;
              if ((!bVar26) || (pbVar20 <= pbVar10)) break;
              pbVar6 = pbVar10 + 1;
              pbVar7 = pbVar16 + 1;
            } while (*pbVar16 == *pbVar10);
          }
          if (bVar26) {
            iVar22 = 1;
            if (bVar25 != false) {
              iVar22 = (uint)*pbVar16 - (uint)*pbVar10;
            }
          }
          else {
            iVar22 = -(uint)bVar25;
          }
          if (iVar22 == 0) goto LAB_001cd128;
        }
      }
      else {
LAB_001cd128:
        *first = ~*first;
      }
      if ((local_48c & 4) != 0) {
        uVar8 = (ulong)((int)((uint *)last)[-1] >> 0x1f ^ ((uint *)last)[-1]);
        uVar21 = *last;
        pbVar16 = T + (long)PA[uVar8] + 2;
        pbVar10 = T + (long)PA[(int)uVar21] + 2;
        pbVar20 = T + (long)PA[(long)(int)uVar21 + 1] + 2;
        bVar25 = pbVar10 < pbVar20;
        bVar26 = pbVar16 < T + (long)PA[uVar8 + 1] + 2;
        if (((bVar26) && (pbVar10 < pbVar20)) && (*pbVar16 == *pbVar10)) {
          pbVar6 = T + (long)PA[uVar8] + 3;
          pbVar7 = T + (long)PA[(int)uVar21] + 3;
          do {
            pbVar10 = pbVar7;
            pbVar16 = pbVar6;
            bVar25 = pbVar10 < pbVar20;
            bVar26 = pbVar16 < T + (long)PA[uVar8 + 1] + 2;
            if ((!bVar26) || (pbVar20 <= pbVar10)) break;
            pbVar6 = pbVar16 + 1;
            pbVar7 = pbVar10 + 1;
          } while (*pbVar16 == *pbVar10);
        }
        if (bVar26) {
          iVar22 = 1;
          if (bVar25 != false) {
            iVar22 = (uint)*pbVar16 - (uint)*pbVar10;
          }
        }
        else {
          iVar22 = -(uint)bVar25;
        }
        if (iVar22 == 0) {
          *last = ~uVar21;
        }
      }
      if (iVar23 < 0) {
        __assert_fail("0 <= ssize",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xb7f2,
                      "void ss_swapmerge(const unsigned char *, const int *, int *, int *, int *, int *, int, int)"
                     );
      }
      goto LAB_001cd5dc;
    }
    uVar8 = (ulong)uVar21;
    puVar13 = (uint *)middle + -uVar8;
    iVar22 = uVar21 + 1;
    puVar11 = (uint *)middle;
    do {
      uVar21 = puVar11[-uVar8];
      puVar11[-uVar8] = *puVar11;
      *puVar11 = uVar21;
      puVar11 = puVar11 + 1;
      iVar22 = iVar22 + -1;
    } while (1 < iVar22);
    puVar17 = (uint *)middle + uVar8;
    uVar21 = 0;
    puVar15 = (uint *)middle;
    puVar11 = (uint *)middle;
    if (puVar17 < last) {
      if ((int)*puVar17 < 0) {
        *puVar17 = ~*puVar17;
        uVar21 = 1;
        if (first < puVar13) {
          do {
            puVar14 = puVar15 + -1;
            puVar15 = puVar15 + -1;
          } while ((int)*puVar14 < 0);
          uVar21 = 5;
        }
      }
      else {
        uVar21 = 0;
        if (first < puVar13) {
          puVar11 = (uint *)middle + -1;
          do {
            puVar14 = puVar11 + 1;
            puVar11 = puVar11 + 1;
          } while ((int)*puVar14 < 0);
          uVar21 = 2;
        }
      }
    }
    if ((long)last - (long)puVar11 < (long)puVar15 - (long)first) {
      if (0x1f < iVar23) {
        __assert_fail("ssize < STACK_SIZE",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xb7ea,
                      "void ss_swapmerge(const unsigned char *, const int *, int *, int *, int *, int *, int, int)"
                     );
      }
      uVar19 = uVar21 ^ 6;
      if ((uVar21 & 2) == 0) {
        uVar19 = uVar21;
      }
      if (puVar11 != (uint *)middle) {
        uVar19 = uVar21;
      }
      lVar9 = (long)iVar23;
      auStack_438[lVar9 * 4] = (ulong)first;
      auStack_438[lVar9 * 4 + 1] = (ulong)puVar13;
      *(uint **)(auStack_420 + lVar9 * 8 + -2) = puVar15;
      uVar8 = (ulong)(iVar23 + 1);
      auStack_420[lVar9 * 8] = uVar19 & 0xfffffffc | local_48c & 3;
      local_48c = local_48c & 4 | uVar19 & 3;
      first = (int *)puVar11;
      middle = (int *)puVar17;
    }
    else {
      if (0x1f < iVar23) {
        __assert_fail("ssize < STACK_SIZE",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xb7e6,
                      "void ss_swapmerge(const unsigned char *, const int *, int *, int *, int *, int *, int, int)"
                     );
      }
      lVar9 = (long)iVar23;
      auStack_438[lVar9 * 4] = (ulong)puVar11;
      auStack_438[lVar9 * 4 + 1] = (ulong)puVar17;
      *(int **)(auStack_420 + lVar9 * 8 + -2) = last;
      uVar8 = (ulong)(iVar23 + 1);
      auStack_420[lVar9 * 8] = local_48c & 4 | uVar21 & 3;
      local_48c = local_48c & 3 | uVar21 & 0xfffffffc;
      middle = (int *)puVar13;
      last = (int *)puVar15;
    }
  } while( true );
  for (; buf < puVar13; puVar13 = puVar13 + -1) {
    *puVar11 = *puVar13;
    *puVar13 = puVar11[-1];
    puVar11 = puVar11 + -1;
  }
  goto LAB_001cd437;
joined_r0x001cd3fe:
  for (; buf < puVar13; puVar13 = puVar13 + -1) {
    *puVar11 = *puVar13;
    *puVar13 = puVar11[-1];
    puVar11 = puVar11 + -1;
  }
LAB_001cd437:
  *puVar11 = *puVar13;
  puVar17 = puVar13;
LAB_001cd43b:
  *puVar17 = uVar19;
LAB_001cd43e:
  if ((local_48c & 1) == 0) {
    if ((local_48c & 2) != 0) {
      uVar8 = (ulong)((int)((uint *)first)[-1] >> 0x1f ^ ((uint *)first)[-1]);
      pbVar16 = T + (long)PA[uVar8] + 2;
      pbVar10 = T + (long)PA[*first] + 2;
      pbVar20 = T + (long)PA[(long)*first + 1] + 2;
      bVar25 = pbVar10 < pbVar20;
      bVar26 = pbVar16 < T + (long)PA[uVar8 + 1] + 2;
      if (((bVar26) && (pbVar10 < pbVar20)) && (*pbVar16 == *pbVar10)) {
        pbVar6 = T + (long)PA[uVar8] + 3;
        pbVar7 = T + (long)PA[*first] + 3;
        do {
          pbVar10 = pbVar7;
          pbVar16 = pbVar6;
          bVar25 = pbVar10 < pbVar20;
          bVar26 = pbVar16 < T + (long)PA[uVar8 + 1] + 2;
          if ((!bVar26) || (pbVar20 <= pbVar10)) break;
          pbVar6 = pbVar16 + 1;
          pbVar7 = pbVar10 + 1;
        } while (*pbVar16 == *pbVar10);
      }
      if (bVar26) {
        iVar22 = 1;
        if (bVar25 != false) {
          iVar22 = (uint)*pbVar16 - (uint)*pbVar10;
        }
      }
      else {
        iVar22 = -(uint)bVar25;
      }
      if (iVar22 == 0) goto LAB_001cd509;
    }
  }
  else {
LAB_001cd509:
    *first = ~*first;
  }
  if ((local_48c & 4) != 0) {
    uVar8 = (ulong)((int)((uint *)last)[-1] >> 0x1f ^ ((uint *)last)[-1]);
    uVar21 = *last;
    pbVar16 = T + (long)PA[uVar8] + 2;
    pbVar10 = T + (long)PA[(int)uVar21] + 2;
    pbVar20 = T + (long)PA[(long)(int)uVar21 + 1] + 2;
    bVar25 = pbVar10 < pbVar20;
    bVar26 = pbVar16 < T + (long)PA[uVar8 + 1] + 2;
    if (((bVar26) && (pbVar10 < pbVar20)) && (*pbVar16 == *pbVar10)) {
      pbVar6 = T + (long)PA[uVar8] + 3;
      pbVar7 = T + (long)PA[(int)uVar21] + 3;
      do {
        pbVar10 = pbVar7;
        pbVar16 = pbVar6;
        bVar25 = pbVar10 < pbVar20;
        bVar26 = pbVar16 < T + (long)PA[uVar8 + 1] + 2;
        if ((!bVar26) || (pbVar20 <= pbVar10)) break;
        pbVar6 = pbVar16 + 1;
        pbVar7 = pbVar10 + 1;
      } while (*pbVar16 == *pbVar10);
    }
    if (bVar26) {
      iVar22 = 1;
      if (bVar25 != false) {
        iVar22 = (uint)*pbVar16 - (uint)*pbVar10;
      }
    }
    else {
      iVar22 = -(uint)bVar25;
    }
    if (iVar22 == 0) {
      *last = ~uVar21;
    }
  }
  if (iVar23 < 0) {
    __assert_fail("0 <= ssize",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xb7bf,
                  "void ss_swapmerge(const unsigned char *, const int *, int *, int *, int *, int *, int, int)"
                 );
  }
  goto LAB_001cd5dc;
joined_r0x001cd20a:
  for (; puVar11 < puVar15; puVar11 = puVar11 + 1) {
    *puVar13 = *puVar11;
    *puVar11 = puVar13[1];
    puVar13 = puVar13 + 1;
  }
  goto LAB_001cd249;
joined_r0x001cd0d0:
  for (; puVar11 < puVar15; puVar11 = puVar11 + 1) {
    *puVar13 = *puVar11;
    *puVar11 = puVar13[1];
    puVar13 = puVar13 + 1;
  }
LAB_001cd249:
  puVar15 = puVar11;
  *puVar13 = *puVar15;
LAB_001cd251:
  *puVar15 = uVar21;
LAB_001cd254:
  if ((local_48c & 1) == 0) {
    if ((local_48c & 2) != 0) {
      uVar8 = (ulong)((int)((uint *)first)[-1] >> 0x1f ^ ((uint *)first)[-1]);
      pbVar16 = T + (long)PA[uVar8] + 2;
      pbVar10 = T + (long)PA[*first] + 2;
      pbVar20 = T + (long)PA[(long)*first + 1] + 2;
      bVar25 = pbVar10 < pbVar20;
      bVar26 = pbVar16 < T + (long)PA[uVar8 + 1] + 2;
      if (((bVar26) && (pbVar10 < pbVar20)) && (*pbVar16 == *pbVar10)) {
        pbVar6 = T + (long)PA[uVar8] + 3;
        pbVar7 = T + (long)PA[*first] + 3;
        do {
          pbVar10 = pbVar7;
          pbVar16 = pbVar6;
          bVar25 = pbVar10 < pbVar20;
          bVar26 = pbVar16 < T + (long)PA[uVar8 + 1] + 2;
          if ((!bVar26) || (pbVar20 <= pbVar10)) break;
          pbVar6 = pbVar16 + 1;
          pbVar7 = pbVar10 + 1;
        } while (*pbVar16 == *pbVar10);
      }
      if (bVar26) {
        iVar22 = 1;
        if (bVar25 != false) {
          iVar22 = (uint)*pbVar16 - (uint)*pbVar10;
        }
      }
      else {
        iVar22 = -(uint)bVar25;
      }
      if (iVar22 == 0) goto LAB_001cd31f;
    }
  }
  else {
LAB_001cd31f:
    *first = ~*first;
  }
  if ((local_48c & 4) != 0) {
    uVar8 = (ulong)((int)((uint *)last)[-1] >> 0x1f ^ ((uint *)last)[-1]);
    uVar21 = *last;
    pbVar16 = T + (long)PA[uVar8] + 2;
    pbVar10 = T + (long)PA[(int)uVar21] + 2;
    pbVar20 = T + (long)PA[(long)(int)uVar21 + 1] + 2;
    bVar25 = pbVar10 < pbVar20;
    bVar26 = pbVar16 < T + (long)PA[uVar8 + 1] + 2;
    if (((bVar26) && (pbVar10 < pbVar20)) && (*pbVar16 == *pbVar10)) {
      pbVar6 = T + (long)PA[uVar8] + 3;
      pbVar7 = T + (long)PA[(int)uVar21] + 3;
      do {
        pbVar10 = pbVar7;
        pbVar16 = pbVar6;
        bVar25 = pbVar10 < pbVar20;
        bVar26 = pbVar16 < T + (long)PA[uVar8 + 1] + 2;
        if ((!bVar26) || (pbVar20 <= pbVar10)) break;
        pbVar6 = pbVar16 + 1;
        pbVar7 = pbVar10 + 1;
      } while (*pbVar16 == *pbVar10);
    }
    if (bVar26) {
      iVar22 = 1;
      if (bVar25 != false) {
        iVar22 = (uint)*pbVar16 - (uint)*pbVar10;
      }
    }
    else {
      iVar22 = -(uint)bVar25;
    }
    if (iVar22 == 0) {
      *last = ~uVar21;
    }
  }
  if (iVar23 < 0) {
    __assert_fail("0 <= ssize",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xb7c8,
                  "void ss_swapmerge(const unsigned char *, const int *, int *, int *, int *, int *, int, int)"
                 );
  }
LAB_001cd5dc:
  if (iVar23 == 0) {
    return;
  }
  uVar8 = (ulong)(iVar23 - 1);
  first = (int *)auStack_438[uVar8 * 4];
  middle = (int *)auStack_438[uVar8 * 4 + 1];
  last = *(int **)(auStack_420 + uVar8 * 8 + -2);
  local_48c = auStack_420[uVar8 * 8];
  goto LAB_001cc739;
}

Assistant:

static
void
ss_swapmerge(const unsigned char *T, const int *PA,
             int *first, int *middle, int *last,
             int *buf, int bufsize, int depth) {
#define STACK_SIZE SS_SMERGE_STACKSIZE
#define GETIDX(a) ((0 <= (a)) ? (a) : (~(a)))
#define MERGE_CHECK(a, b, c)\
  do {\
    if(((c) & 1) ||\
       (((c) & 2) && (ss_compare(T, PA + GETIDX(*((a) - 1)), PA + *(a), depth) == 0))) {\
      *(a) = ~*(a);\
    }\
    if(((c) & 4) && ((ss_compare(T, PA + GETIDX(*((b) - 1)), PA + *(b), depth) == 0))) {\
      *(b) = ~*(b);\
    }\
  } while(0)
  struct { int *a, *b, *c; int d; } stack[STACK_SIZE];
  int *l, *r, *lm, *rm;
  int m, len, half;
  int ssize;
  int check, next;

  for(check = 0, ssize = 0;;) {
    if((last - middle) <= bufsize) {
      if((first < middle) && (middle < last)) {
        ss_mergebackward(T, PA, first, middle, last, buf, depth);
      }
      MERGE_CHECK(first, last, check);
      STACK_POP(first, middle, last, check);
      continue;
    }

    if((middle - first) <= bufsize) {
      if(first < middle) {
        ss_mergeforward(T, PA, first, middle, last, buf, depth);
      }
      MERGE_CHECK(first, last, check);
      STACK_POP(first, middle, last, check);
      continue;
    }

    for(m = 0, len = MIN(middle - first, last - middle), half = len >> 1;
        0 < len;
        len = half, half >>= 1) {
      if(ss_compare(T, PA + GETIDX(*(middle + m + half)),
                       PA + GETIDX(*(middle - m - half - 1)), depth) < 0) {
        m += half + 1;
        half -= (len & 1) ^ 1;
      }
    }

    if(0 < m) {
      lm = middle - m, rm = middle + m;
      ss_blockswap(lm, middle, m);
      l = r = middle, next = 0;
      if(rm < last) {
        if(*rm < 0) {
          *rm = ~*rm;
          if(first < lm) { for(; *--l < 0;) { } next |= 4; }
          next |= 1;
        } else if(first < lm) {
          for(; *r < 0; ++r) { }
          next |= 2;
        }
      }

      if((l - first) <= (last - r)) {
        STACK_PUSH(r, rm, last, (next & 3) | (check & 4));
        middle = lm, last = l, check = (check & 3) | (next & 4);
      } else {
        if((next & 2) && (r == middle)) { next ^= 6; }
        STACK_PUSH(first, lm, l, (check & 3) | (next & 4));
        first = r, middle = rm, check = (next & 3) | (check & 4);
      }
    } else {
      if(ss_compare(T, PA + GETIDX(*(middle - 1)), PA + *middle, depth) == 0) {
        *middle = ~*middle;
      }
      MERGE_CHECK(first, last, check);
      STACK_POP(first, middle, last, check);
    }
  }
#undef STACK_SIZE
}